

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfKeyCode.cpp
# Opt level: O3

bool __thiscall Imf_3_4::KeyCode::operator==(KeyCode *this,KeyCode *other)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  
  auVar2[0] = -((char)other->_filmMfcCode == (char)this->_filmMfcCode);
  auVar2[1] = -(*(char *)((long)&other->_filmMfcCode + 1) ==
               *(char *)((long)&this->_filmMfcCode + 1));
  auVar2[2] = -(*(char *)((long)&other->_filmMfcCode + 2) ==
               *(char *)((long)&this->_filmMfcCode + 2));
  auVar2[3] = -(*(char *)((long)&other->_filmMfcCode + 3) ==
               *(char *)((long)&this->_filmMfcCode + 3));
  auVar2[4] = -((char)other->_filmType == (char)this->_filmType);
  auVar2[5] = -(*(char *)((long)&other->_filmType + 1) == *(char *)((long)&this->_filmType + 1));
  auVar2[6] = -(*(char *)((long)&other->_filmType + 2) == *(char *)((long)&this->_filmType + 2));
  auVar2[7] = -(*(char *)((long)&other->_filmType + 3) == *(char *)((long)&this->_filmType + 3));
  auVar2[8] = -((char)other->_prefix == (char)this->_prefix);
  auVar2[9] = -(*(char *)((long)&other->_prefix + 1) == *(char *)((long)&this->_prefix + 1));
  auVar2[10] = -(*(char *)((long)&other->_prefix + 2) == *(char *)((long)&this->_prefix + 2));
  auVar2[0xb] = -(*(char *)((long)&other->_prefix + 3) == *(char *)((long)&this->_prefix + 3));
  auVar2[0xc] = -((char)other->_count == (char)this->_count);
  auVar2[0xd] = -(*(char *)((long)&other->_count + 1) == *(char *)((long)&this->_count + 1));
  auVar2[0xe] = -(*(char *)((long)&other->_count + 2) == *(char *)((long)&this->_count + 2));
  auVar2[0xf] = -(*(char *)((long)&other->_count + 3) == *(char *)((long)&this->_count + 3));
  auVar1[0] = -((char)other->_count == (char)this->_count);
  auVar1[1] = -(*(char *)((long)&other->_count + 1) == *(char *)((long)&this->_count + 1));
  auVar1[2] = -(*(char *)((long)&other->_count + 2) == *(char *)((long)&this->_count + 2));
  auVar1[3] = -(*(char *)((long)&other->_count + 3) == *(char *)((long)&this->_count + 3));
  auVar1[4] = -((char)other->_perfOffset == (char)this->_perfOffset);
  auVar1[5] = -(*(char *)((long)&other->_perfOffset + 1) == *(char *)((long)&this->_perfOffset + 1))
  ;
  auVar1[6] = -(*(char *)((long)&other->_perfOffset + 2) == *(char *)((long)&this->_perfOffset + 2))
  ;
  auVar1[7] = -(*(char *)((long)&other->_perfOffset + 3) == *(char *)((long)&this->_perfOffset + 3))
  ;
  auVar1[8] = -((char)other->_perfsPerFrame == (char)this->_perfsPerFrame);
  auVar1[9] = -(*(char *)((long)&other->_perfsPerFrame + 1) ==
               *(char *)((long)&this->_perfsPerFrame + 1));
  auVar1[10] = -(*(char *)((long)&other->_perfsPerFrame + 2) ==
                *(char *)((long)&this->_perfsPerFrame + 2));
  auVar1[0xb] = -(*(char *)((long)&other->_perfsPerFrame + 3) ==
                 *(char *)((long)&this->_perfsPerFrame + 3));
  auVar1[0xc] = -((char)other->_perfsPerCount == (char)this->_perfsPerCount);
  auVar1[0xd] = -(*(char *)((long)&other->_perfsPerCount + 1) ==
                 *(char *)((long)&this->_perfsPerCount + 1));
  auVar1[0xe] = -(*(char *)((long)&other->_perfsPerCount + 2) ==
                 *(char *)((long)&this->_perfsPerCount + 2));
  auVar1[0xf] = -(*(char *)((long)&other->_perfsPerCount + 3) ==
                 *(char *)((long)&this->_perfsPerCount + 3));
  auVar1 = auVar1 & auVar2;
  return (ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) | (ushort)(SUB161(auVar1 >> 0xf,0) & 1) << 1 |
                  (ushort)(SUB161(auVar1 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar1 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar1 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar1 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar1 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar1 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar1 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar1 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar1 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar1 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar1 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar1 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar1 >> 0x77,0) & 1) << 0xe |
                 (ushort)(byte)(auVar1[0xf] >> 7) << 0xf) == 0xffff;
}

Assistant:

bool
KeyCode::operator== (const KeyCode& other) const
{
    return (_filmMfcCode   == other._filmMfcCode &&
            _filmType      == other._filmType &&
            _prefix        == other._prefix &&
            _count         == other._count &&
            _perfOffset    == other._perfOffset &&
            _perfsPerFrame == other._perfsPerFrame &&
            _perfsPerCount == other._perfsPerCount);
}